

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O0

int Rtm_ObjCheckRetimeBwd(Rtm_Obj_t *pObj)

{
  Rtm_Edg_t *pRVar1;
  int local_24;
  int i;
  Rtm_Edg_t *pEdge;
  Rtm_Obj_t *pObj_local;
  
  local_24 = 0;
  while( true ) {
    if (pObj->nFanouts <= local_24) {
      return 1;
    }
    pRVar1 = Rtm_ObjFanoutEdge(pObj,local_24);
    if (((ulong)*pRVar1 & 0xfff) == 0) break;
    local_24 = local_24 + 1;
  }
  return 0;
}

Assistant:

int Rtm_ObjCheckRetimeBwd( Rtm_Obj_t * pObj )
{
    Rtm_Edg_t * pEdge;
    int i;
    Rtm_ObjForEachFanoutEdge( pObj, pEdge, i )
        if ( pEdge->nLats == 0 )
            return 0;
    return 1;
}